

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer_start_twice(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  undefined8 uVar2;
  long lVar3;
  long *plVar4;
  uv__queue *puVar5;
  undefined8 unaff_RBX;
  uv_loop_t *puVar6;
  long *plVar7;
  code **ppcVar8;
  uv_timer_t *puVar9;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t once;
  undefined1 auStack_400 [120];
  uv_loop_t *puStack_388;
  code *pcStack_380;
  void *pvStack_378;
  undefined1 auStack_370 [16];
  undefined8 uStack_360;
  uv__queue *puStack_358;
  undefined1 auStack_350 [24];
  uv_close_cb p_Stack_338;
  uv__queue *puStack_330;
  undefined8 uStack_320;
  undefined1 auStack_318 [176];
  code *pcStack_268;
  long lStack_260;
  long lStack_258;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  long *aplStack_248 [15];
  long *aplStack_1d0 [15];
  long *plStack_158;
  undefined1 auStack_130 [120];
  code *pcStack_b8;
  undefined8 uStack_b0;
  long lStack_a8;
  code *pcStack_a0;
  long local_90;
  long local_88;
  undefined1 local_80 [120];
  
  pcStack_a0 = (code *)0x1d6298;
  uVar2 = uv_default_loop();
  pcStack_a0 = (code *)0x1d62a5;
  iVar1 = uv_timer_init(uVar2,local_80);
  local_88 = (long)iVar1;
  local_90 = 0;
  if (local_88 == 0) {
    pcStack_a0 = (code *)0x1d62dd;
    iVar1 = uv_timer_start(local_80,never_cb,86400000,0);
    local_88 = (long)iVar1;
    local_90 = 0;
    if (local_88 != 0) goto LAB_001d63f4;
    pcStack_a0 = (code *)0x1d6315;
    iVar1 = uv_timer_start(local_80,twice_cb,10,0);
    local_88 = (long)iVar1;
    local_90 = 0;
    if (local_88 != 0) goto LAB_001d6403;
    pcStack_a0 = (code *)0x1d633a;
    uVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1d6344;
    iVar1 = uv_run(uVar2,0);
    local_88 = (long)iVar1;
    local_90 = 0;
    if (local_88 != 0) goto LAB_001d6412;
    local_88 = 1;
    local_90 = (long)twice_cb_called;
    if (local_90 != 1) goto LAB_001d6421;
    pcStack_a0 = (code *)0x1d638e;
    unaff_RBX = uv_default_loop();
    pcStack_a0 = (code *)0x1d63a2;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_a0 = (code *)0x1d63ac;
    uv_run(unaff_RBX,0);
    local_88 = 0;
    pcStack_a0 = (code *)0x1d63ba;
    uVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1d63c2;
    iVar1 = uv_loop_close(uVar2);
    local_90 = (long)iVar1;
    if (local_88 == local_90) {
      pcStack_a0 = (code *)0x1d63da;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_a0 = (code *)0x1d63f4;
    run_test_timer_start_twice_cold_1();
LAB_001d63f4:
    pcStack_a0 = (code *)0x1d6403;
    run_test_timer_start_twice_cold_2();
LAB_001d6403:
    pcStack_a0 = (code *)0x1d6412;
    run_test_timer_start_twice_cold_3();
LAB_001d6412:
    pcStack_a0 = (code *)0x1d6421;
    run_test_timer_start_twice_cold_4();
LAB_001d6421:
    pcStack_a0 = (code *)0x1d6430;
    run_test_timer_start_twice_cold_5();
  }
  plVar4 = &local_88;
  pcStack_a0 = twice_cb;
  run_test_timer_start_twice_cold_6();
  pcStack_b8 = (code *)0x1d645b;
  pcStack_a0 = (code *)unaff_RBX;
  printf("TWICE_CB %d\n",(ulong)(uint)twice_cb_called);
  if (plVar4 == (long *)0x0) {
    pcStack_b8 = (code *)0x1d64a1;
    twice_cb_cold_2();
  }
  else {
    pcStack_b8 = (code *)0x1d6468;
    iVar1 = uv_is_active(plVar4);
    lStack_a8 = (long)iVar1;
    uStack_b0 = 0;
    if (lStack_a8 == 0) {
      twice_cb_called = twice_cb_called + 1;
      iVar1 = uv_close(plVar4,twice_close_cb);
      return iVar1;
    }
  }
  pcStack_b8 = run_test_timer_init;
  twice_cb_cold_1();
  pcStack_b8 = (code *)plVar4;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_130);
  if (iVar1 == 0) {
    lVar3 = uv_timer_get_repeat(auStack_130);
    if (lVar3 != 0) goto LAB_001d65cd;
    uv_timer_get_due_in(auStack_130);
    iVar1 = uv_is_active(auStack_130);
    if (iVar1 != 0) goto LAB_001d65eb;
    plVar4 = (long *)uv_default_loop();
    uv_walk(plVar4,close_walk_cb,0);
    uv_run(plVar4,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_timer_init_cold_1();
LAB_001d65cd:
    run_test_timer_init_cold_2();
    run_test_timer_init_cold_5();
LAB_001d65eb:
    run_test_timer_init_cold_3();
  }
  run_test_timer_init_cold_4();
  plVar7 = &lStack_260;
  uStack_24c = 0;
  uStack_250 = 1;
  pcStack_268 = (code *)0x1d6628;
  plStack_158 = plVar4;
  uVar2 = uv_default_loop();
  pcStack_268 = (code *)0x1d6638;
  iVar1 = uv_timer_init(uVar2,aplStack_1d0);
  aplStack_248[0] = (long *)(long)iVar1;
  lStack_260 = 0;
  if (aplStack_248[0] == (long *)0x0) {
    pcStack_268 = (code *)0x1d665b;
    uVar2 = uv_default_loop();
    pcStack_268 = (code *)0x1d6668;
    iVar1 = uv_timer_init(uVar2,aplStack_248);
    lStack_260 = (long)iVar1;
    lStack_258 = 0;
    if (lStack_260 != 0) goto LAB_001d68d8;
    plVar4 = (long *)&uStack_24c;
    pcStack_268 = (code *)0x1d66a6;
    aplStack_1d0[0] = plVar4;
    iVar1 = uv_timer_start(aplStack_1d0,order_cb_a,0,0);
    lStack_260 = (long)iVar1;
    lStack_258 = 0;
    if (lStack_260 != 0) goto LAB_001d68e5;
    pcStack_268 = (code *)0x1d66e1;
    aplStack_248[0] = (long *)&uStack_250;
    iVar1 = uv_timer_start(aplStack_248,order_cb_b,0,0);
    lStack_260 = (long)iVar1;
    lStack_258 = 0;
    if (lStack_260 != 0) goto LAB_001d68f2;
    pcStack_268 = (code *)0x1d6704;
    uVar2 = uv_default_loop();
    pcStack_268 = (code *)0x1d670e;
    iVar1 = uv_run(uVar2,0);
    lStack_260 = (long)iVar1;
    lStack_258 = 0;
    if (lStack_260 != 0) goto LAB_001d68ff;
    lStack_260 = 2;
    lStack_258 = (long)order_cb_called;
    if (lStack_258 != 2) goto LAB_001d690c;
    pcStack_268 = (code *)0x1d675c;
    iVar1 = uv_timer_stop(aplStack_1d0);
    lStack_260 = (long)iVar1;
    lStack_258 = 0;
    if (lStack_260 != 0) goto LAB_001d6919;
    pcStack_268 = (code *)0x1d6784;
    iVar1 = uv_timer_stop(aplStack_248);
    lStack_260 = (long)iVar1;
    lStack_258 = 0;
    if (lStack_260 != 0) goto LAB_001d6926;
    order_cb_called = 0;
    pcStack_268 = (code *)0x1d67c4;
    aplStack_248[0] = plVar4;
    iVar1 = uv_timer_start(aplStack_248,order_cb_b,0,0);
    lStack_260 = (long)iVar1;
    lStack_258 = 0;
    if (lStack_260 != 0) goto LAB_001d6933;
    pcStack_268 = (code *)0x1d67fd;
    aplStack_1d0[0] = (long *)&uStack_250;
    iVar1 = uv_timer_start(aplStack_1d0,order_cb_a,0,0);
    lStack_260 = (long)iVar1;
    lStack_258 = 0;
    if (lStack_260 != 0) goto LAB_001d6940;
    pcStack_268 = (code *)0x1d6820;
    uVar2 = uv_default_loop();
    pcStack_268 = (code *)0x1d682a;
    iVar1 = uv_run(uVar2,0);
    lStack_260 = (long)iVar1;
    lStack_258 = 0;
    if (lStack_260 != 0) goto LAB_001d694d;
    lStack_260 = 2;
    lStack_258 = (long)order_cb_called;
    if (lStack_258 != 2) goto LAB_001d695a;
    pcStack_268 = (code *)0x1d6870;
    plVar4 = (long *)uv_default_loop();
    pcStack_268 = (code *)0x1d6884;
    uv_walk(plVar4,close_walk_cb,0);
    pcStack_268 = (code *)0x1d688e;
    uv_run(plVar4,0);
    lStack_260 = 0;
    pcStack_268 = (code *)0x1d689b;
    uVar2 = uv_default_loop();
    pcStack_268 = (code *)0x1d68a3;
    iVar1 = uv_loop_close(uVar2);
    lStack_258 = (long)iVar1;
    if (lStack_260 == lStack_258) {
      pcStack_268 = (code *)0x1d68be;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_268 = (code *)0x1d68d8;
    run_test_timer_order_cold_1();
LAB_001d68d8:
    pcStack_268 = (code *)0x1d68e5;
    run_test_timer_order_cold_2();
LAB_001d68e5:
    pcStack_268 = (code *)0x1d68f2;
    run_test_timer_order_cold_3();
LAB_001d68f2:
    pcStack_268 = (code *)0x1d68ff;
    run_test_timer_order_cold_4();
LAB_001d68ff:
    pcStack_268 = (code *)0x1d690c;
    run_test_timer_order_cold_5();
LAB_001d690c:
    pcStack_268 = (code *)0x1d6919;
    run_test_timer_order_cold_6();
LAB_001d6919:
    pcStack_268 = (code *)0x1d6926;
    run_test_timer_order_cold_7();
LAB_001d6926:
    pcStack_268 = (code *)0x1d6933;
    run_test_timer_order_cold_8();
LAB_001d6933:
    pcStack_268 = (code *)0x1d6940;
    run_test_timer_order_cold_9();
LAB_001d6940:
    pcStack_268 = (code *)0x1d694d;
    run_test_timer_order_cold_10();
LAB_001d694d:
    pcStack_268 = (code *)0x1d695a;
    run_test_timer_order_cold_11();
LAB_001d695a:
    pcStack_268 = (code *)0x1d6967;
    run_test_timer_order_cold_12();
  }
  pcStack_268 = order_cb_a;
  run_test_timer_order_cold_13();
  iVar1 = order_cb_called;
  pcStack_268 = (code *)(long)order_cb_called;
  order_cb_called = order_cb_called + 1;
  auStack_318._168_8_ = SEXT48(*(int *)*plVar7);
  if (pcStack_268 == (code *)auStack_318._168_8_) {
    return iVar1;
  }
  ppcVar8 = &pcStack_268;
  auStack_318._152_8_ = order_cb_b;
  order_cb_a_cold_1();
  iVar1 = order_cb_called;
  auStack_318._152_8_ = SEXT48(order_cb_called);
  order_cb_called = order_cb_called + 1;
  auStack_318._144_8_ = SEXT48(*(int *)*ppcVar8);
  if (auStack_318._152_8_ == auStack_318._144_8_) {
    return iVar1;
  }
  auStack_318._128_8_ = run_test_timer_zero_timeout;
  order_cb_b_cold_1();
  puStack_330 = (uv__queue *)0x1d6a09;
  auStack_318._128_8_ = plVar4;
  puVar5 = (uv__queue *)uv_default_loop();
  puStack_330 = (uv__queue *)0x1d6a19;
  iVar1 = uv_timer_init(puVar5,auStack_318 + 8);
  auStack_318._0_8_ = SEXT48(iVar1);
  uStack_320 = (uv_handle_t *)0x0;
  if ((uv_handle_t *)auStack_318._0_8_ == (uv_handle_t *)0x0) {
    puStack_330 = (uv__queue *)0x1d6a4e;
    iVar1 = uv_timer_start(auStack_318 + 8,zero_timeout_cb,0,0);
    auStack_318._0_8_ = SEXT48(iVar1);
    uStack_320 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_318._0_8_ != (uv_handle_t *)0x0) goto LAB_001d6b76;
    auStack_318._0_8_ = (uv_handle_t *)0x1;
    puStack_330 = (uv__queue *)0x1d6a81;
    iVar1 = uv_run(puVar5,0);
    uStack_320 = SEXT48(iVar1);
    if (auStack_318._0_8_ != uStack_320) goto LAB_001d6b85;
    auStack_318._0_8_ = (uv_handle_t *)0x1;
    uStack_320 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_320 != (uv_handle_t *)0x1) goto LAB_001d6b94;
    puStack_330 = (uv__queue *)0x1d6ac9;
    uv_close(auStack_318 + 8,0);
    puStack_330 = (uv__queue *)0x1d6ad3;
    iVar1 = uv_run(puVar5,0);
    auStack_318._0_8_ = SEXT48(iVar1);
    uStack_320 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_318._0_8_ != (uv_handle_t *)0x0) goto LAB_001d6ba3;
    auStack_318._0_8_ = (uv_handle_t *)0x1;
    uStack_320 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_320 != (uv_handle_t *)0x1) goto LAB_001d6bb2;
    puStack_330 = (uv__queue *)0x1d6b29;
    uv_walk(puVar5,close_walk_cb,0);
    puStack_330 = (uv__queue *)0x1d6b33;
    uv_run(puVar5,0);
    auStack_318._0_8_ = (uv_handle_t *)0x0;
    puStack_330 = (uv__queue *)0x1d6b44;
    iVar1 = uv_loop_close(puVar5);
    uStack_320 = SEXT48(iVar1);
    if (auStack_318._0_8_ == uStack_320) {
      puStack_330 = (uv__queue *)0x1d6b5c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_330 = (uv__queue *)0x1d6b76;
    run_test_timer_zero_timeout_cold_1();
LAB_001d6b76:
    puStack_330 = (uv__queue *)0x1d6b85;
    run_test_timer_zero_timeout_cold_2();
LAB_001d6b85:
    puStack_330 = (uv__queue *)0x1d6b94;
    run_test_timer_zero_timeout_cold_3();
LAB_001d6b94:
    puStack_330 = (uv__queue *)0x1d6ba3;
    run_test_timer_zero_timeout_cold_4();
LAB_001d6ba3:
    puStack_330 = (uv__queue *)0x1d6bb2;
    run_test_timer_zero_timeout_cold_5();
LAB_001d6bb2:
    puStack_330 = (uv__queue *)0x1d6bc1;
    run_test_timer_zero_timeout_cold_6();
  }
  puVar6 = (uv_loop_t *)auStack_318;
  puStack_330 = (uv__queue *)zero_timeout_cb;
  run_test_timer_zero_timeout_cold_7();
  auStack_350._8_8_ = (uv_loop_t *)0x1d6be8;
  puStack_330 = puVar5;
  iVar1 = uv_timer_start();
  p_Stack_338 = (uv_close_cb)(long)iVar1;
  auStack_350._16_8_ = (uv_handle_t *)0x0;
  if (p_Stack_338 == (uv_close_cb)0x0) {
    auStack_350._8_8_ = (uv_loop_t *)0x1d6c0b;
    iVar1 = uv_stop(*(undefined8 *)&puVar6->active_handles);
    zero_timeout_cb_calls = zero_timeout_cb_calls + 1;
    return iVar1;
  }
  auStack_350._8_8_ = run_test_timer_huge_timeout;
  zero_timeout_cb_cold_1();
  uStack_360._0_4_ = 0x1d6c2e;
  uStack_360._4_4_ = 0;
  auStack_350._8_8_ = puVar6;
  uVar2 = uv_default_loop();
  uStack_360._0_4_ = 0x1d6c3d;
  uStack_360._4_4_ = 0;
  iVar1 = uv_timer_init(uVar2,&tiny_timer);
  auStack_350._0_8_ = SEXT48(iVar1);
  puStack_358 = (uv__queue *)0x0;
  if ((uv__queue *)auStack_350._0_8_ == (uv__queue *)0x0) {
    uStack_360._0_4_ = 0x1d6c60;
    uStack_360._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_360._0_4_ = 0x1d6c6f;
    uStack_360._4_4_ = 0;
    iVar1 = uv_timer_init(uVar2,&huge_timer1);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d6e7a;
    uStack_360._0_4_ = 0x1d6c92;
    uStack_360._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_360._0_4_ = 0x1d6ca1;
    uStack_360._4_4_ = 0;
    iVar1 = uv_timer_init(uVar2,&huge_timer2);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d6e87;
    uStack_360._0_4_ = 0x1d6cd9;
    uStack_360._4_4_ = 0;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d6e94;
    puVar6 = (uv_loop_t *)0xffffffffffff;
    uStack_360._0_4_ = 0x1d6d19;
    uStack_360._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d6ea1;
    uStack_360._0_4_ = 0x1d6d53;
    uStack_360._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d6eae;
    auStack_350._0_8_ = (uv__queue *)0x1;
    uStack_360._0_4_ = 0x1d6d86;
    uStack_360._4_4_ = 0;
    puStack_358 = (uv__queue *)uv_timer_get_due_in(&tiny_timer);
    if ((uv__queue *)auStack_350._0_8_ != puStack_358) goto LAB_001d6ebb;
    auStack_350._0_8_ = (uv__queue *)0xffffffffffff;
    uStack_360._0_4_ = 0x1d6daa;
    uStack_360._4_4_ = 0;
    puStack_358 = (uv__queue *)uv_timer_get_due_in(&huge_timer1);
    if ((uv__queue *)auStack_350._0_8_ != puStack_358) goto LAB_001d6ec8;
    auStack_350._0_8_ = (uv__queue *)0x0;
    uStack_360._0_4_ = 0x1d6dd2;
    uStack_360._4_4_ = 0;
    puStack_358 = (uv__queue *)uv_timer_get_due_in(&huge_timer2);
    if (puStack_358 < (ulong)auStack_350._0_8_) goto LAB_001d6ed5;
    uStack_360._0_4_ = 0x1d6dea;
    uStack_360._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_360._0_4_ = 0x1d6df4;
    uStack_360._4_4_ = 0;
    iVar1 = uv_run(uVar2,0);
    auStack_350._0_8_ = SEXT48(iVar1);
    puStack_358 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_350._0_8_ != (uv__queue *)0x0) goto LAB_001d6ee2;
    uStack_360._0_4_ = 0x1d6e17;
    uStack_360._4_4_ = 0;
    puVar6 = (uv_loop_t *)uv_default_loop();
    uStack_360._0_4_ = 0x1d6e2b;
    uStack_360._4_4_ = 0;
    uv_walk(puVar6,close_walk_cb,0);
    uStack_360._0_4_ = 0x1d6e35;
    uStack_360._4_4_ = 0;
    uv_run(puVar6,0);
    auStack_350._0_8_ = (uv__queue *)0x0;
    uStack_360._0_4_ = 0x1d6e43;
    uStack_360._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_360._0_4_ = 0x1d6e4b;
    uStack_360._4_4_ = 0;
    iVar1 = uv_loop_close(uVar2);
    puStack_358 = (uv__queue *)(long)iVar1;
    if ((uv__queue *)auStack_350._0_8_ == puStack_358) {
      uStack_360._0_4_ = 0x1d6e65;
      uStack_360._4_4_ = 0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_360._0_4_ = 0x1d6e7a;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_1();
LAB_001d6e7a:
    uStack_360._0_4_ = 0x1d6e87;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_2();
LAB_001d6e87:
    uStack_360._0_4_ = 0x1d6e94;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_3();
LAB_001d6e94:
    uStack_360._0_4_ = 0x1d6ea1;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_4();
LAB_001d6ea1:
    uStack_360._0_4_ = 0x1d6eae;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_5();
LAB_001d6eae:
    uStack_360._0_4_ = 0x1d6ebb;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_6();
LAB_001d6ebb:
    uStack_360._0_4_ = 0x1d6ec8;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_7();
LAB_001d6ec8:
    uStack_360._0_4_ = 0x1d6ed5;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_8();
LAB_001d6ed5:
    uStack_360._0_4_ = 0x1d6ee2;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_11();
LAB_001d6ee2:
    uStack_360._0_4_ = 0x1d6eef;
    uStack_360._4_4_ = 0;
    run_test_timer_huge_timeout_cold_9();
  }
  puVar9 = (uv_timer_t *)auStack_350;
  uStack_360 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_10();
  if (puVar9 == &tiny_timer) {
    auStack_370._8_8_ = (uv_loop_t *)0x1d6f17;
    uv_close(&tiny_timer,0);
    auStack_370._8_8_ = (uv_loop_t *)0x1d6f25;
    uv_close(&huge_timer1,0);
    iVar1 = uv_close(&huge_timer2,0);
    return iVar1;
  }
  auStack_370._8_8_ = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_380 = (code *)0x1d6f43;
  auStack_370._8_8_ = puVar6;
  uVar2 = uv_default_loop();
  pcStack_380 = (code *)0x1d6f52;
  iVar1 = uv_timer_init(uVar2,&tiny_timer);
  auStack_370._0_8_ = SEXT48(iVar1);
  pvStack_378 = (void *)0x0;
  if ((void *)auStack_370._0_8_ == (void *)0x0) {
    pcStack_380 = (code *)0x1d6f75;
    uVar2 = uv_default_loop();
    pcStack_380 = (code *)0x1d6f84;
    iVar1 = uv_timer_init(uVar2,&huge_timer1);
    auStack_370._0_8_ = SEXT48(iVar1);
    pvStack_378 = (void *)0x0;
    if ((void *)auStack_370._0_8_ != (void *)0x0) goto LAB_001d70ab;
    pcStack_380 = (code *)0x1d6fbf;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    auStack_370._0_8_ = SEXT48(iVar1);
    pvStack_378 = (void *)0x0;
    if ((void *)auStack_370._0_8_ != (void *)0x0) goto LAB_001d70b8;
    pcStack_380 = (code *)0x1d6ffc;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    auStack_370._0_8_ = SEXT48(iVar1);
    pvStack_378 = (void *)0x0;
    if ((void *)auStack_370._0_8_ != (void *)0x0) goto LAB_001d70c5;
    pcStack_380 = (code *)0x1d701f;
    uVar2 = uv_default_loop();
    pcStack_380 = (code *)0x1d7029;
    iVar1 = uv_run(uVar2,0);
    auStack_370._0_8_ = SEXT48(iVar1);
    pvStack_378 = (void *)0x0;
    if ((void *)auStack_370._0_8_ != (void *)0x0) goto LAB_001d70d2;
    pcStack_380 = (code *)0x1d704c;
    puVar6 = (uv_loop_t *)uv_default_loop();
    pcStack_380 = (code *)0x1d7060;
    uv_walk(puVar6,close_walk_cb,0);
    pcStack_380 = (code *)0x1d706a;
    uv_run(puVar6,0);
    auStack_370._0_8_ = (void *)0x0;
    pcStack_380 = (code *)0x1d7078;
    uVar2 = uv_default_loop();
    pcStack_380 = (code *)0x1d7080;
    iVar1 = uv_loop_close(uVar2);
    pvStack_378 = (void *)(long)iVar1;
    if ((void *)auStack_370._0_8_ == pvStack_378) {
      pcStack_380 = (code *)0x1d7096;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_380 = (code *)0x1d70ab;
    run_test_timer_huge_repeat_cold_1();
LAB_001d70ab:
    pcStack_380 = (code *)0x1d70b8;
    run_test_timer_huge_repeat_cold_2();
LAB_001d70b8:
    pcStack_380 = (code *)0x1d70c5;
    run_test_timer_huge_repeat_cold_3();
LAB_001d70c5:
    pcStack_380 = (code *)0x1d70d2;
    run_test_timer_huge_repeat_cold_4();
LAB_001d70d2:
    pcStack_380 = (code *)0x1d70df;
    run_test_timer_huge_repeat_cold_5();
  }
  puVar9 = (uv_timer_t *)auStack_370;
  pcStack_380 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  iVar1 = huge_repeat_cb::ncalls;
  pcStack_380._0_4_ = extraout_EAX;
  if (huge_repeat_cb::ncalls != 0) {
    if (puVar9 == &tiny_timer) goto LAB_001d7114;
    puStack_388 = (uv_loop_t *)0x1d7108;
    huge_repeat_cb_cold_1();
    iVar1 = extraout_EAX_00;
  }
  if (puVar9 == &huge_timer1) {
LAB_001d7114:
    huge_repeat_cb::ncalls = iVar1 + 1;
    if (huge_repeat_cb::ncalls != 10) {
      return (int)pcStack_380;
    }
    puStack_388 = (uv_loop_t *)0x1d712f;
    uv_close(&tiny_timer,0);
    iVar1 = uv_close(&huge_timer1,0);
    return iVar1;
  }
  puStack_388 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_388 = puVar6;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_400);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_400,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001d7345;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_001d7354;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001d7363;
    iVar1 = uv_timer_start(auStack_400,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001d7372;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_001d7381;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001d7390;
    uv_close(auStack_400,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d73ae;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001d7345:
    run_test_timer_run_once_cold_2();
LAB_001d7354:
    run_test_timer_run_once_cold_3();
LAB_001d7363:
    run_test_timer_run_once_cold_4();
LAB_001d7372:
    run_test_timer_run_once_cold_5();
LAB_001d7381:
    run_test_timer_run_once_cold_6();
LAB_001d7390:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001d73ae:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(timer_start_twice) {
  uv_timer_t once;
  int r;

  r = uv_timer_init(uv_default_loop(), &once);
  ASSERT_OK(r);
  r = uv_timer_start(&once, never_cb, 86400 * 1000, 0);
  ASSERT_OK(r);
  r = uv_timer_start(&once, twice_cb, 10, 0);
  ASSERT_OK(r);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, twice_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}